

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void Excel::Parser::loadWorkSheets
               (vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *boundSheets,
               Stream *stream,IStorage *storage)

{
  SheetType SVar1;
  size_type sVar2;
  const_reference pvVar3;
  wstring *pwVar4;
  long *in_RDX;
  vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_> *in_RDI;
  size_t i;
  IStorage *in_stack_000003d8;
  Stream *in_stack_000003e0;
  BoundSheet *in_stack_000003e8;
  size_t in_stack_000003f0;
  undefined8 local_20;
  
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>::size(in_RDI);
    if (sVar2 <= local_20) break;
    pvVar3 = std::vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>::operator[]
                       (in_RDI,local_20);
    SVar1 = BoundSheet::sheetType(pvVar3);
    if (SVar1 == WorkSheet) {
      pvVar3 = std::vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>::operator[]
                         (in_RDI,local_20);
      pwVar4 = BoundSheet::sheetName_abi_cxx11_(pvVar3);
      (**(code **)(*in_RDX + 0x20))(in_RDX,local_20,pwVar4);
      std::vector<Excel::BoundSheet,_std::allocator<Excel::BoundSheet>_>::operator[]
                (in_RDI,local_20);
      loadSheet(in_stack_000003f0,in_stack_000003e8,in_stack_000003e0,in_stack_000003d8);
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

inline void
Parser::loadWorkSheets( const std::vector< BoundSheet > & boundSheets,
	Stream & stream, IStorage& storage )
{
	for( size_t i = 0; i < boundSheets.size(); ++i )
	{
		if( boundSheets[i].sheetType() == BoundSheet::WorkSheet )
		{
			storage.onSheet( i, boundSheets[i].sheetName() );
			loadSheet( i, boundSheets[i], stream, storage );
		}
	}
}